

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O0

void __thiscall LinkInfo::parseLinkInfoHeaderSize(LinkInfo *this)

{
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  uint local_14;
  LinkInfo *pLStack_10;
  int len;
  LinkInfo *this_local;
  
  pLStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,&this->LinkInfoHeaderSize);
  uVar1 = Utils::lenFourBytes(&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  local_14 = uVar1;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  std::operator<<(poVar2," bytes. ");
  if (local_14 == 0x1c) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Offsets to the optional fields are not specified.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (0x23 < (int)local_14) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Offsets to the optional fields are specified.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void LinkInfo::parseLinkInfoHeaderSize() {
    int len = Utils::lenFourBytes(LinkInfoHeaderSize);
    cout << dec << len << " bytes. ";
    if (len == 0x0000001C)
        cout << "Offsets to the optional fields are not specified." << endl;
    else if(len >= 0x00000024) {
        cout << "Offsets to the optional fields are specified." << endl;
    }
}